

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  Lexer *l_00;
  Parser *this;
  size_type sVar4;
  void *this_00;
  GCPtr *this_01;
  Object *obj;
  Env *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  undefined1 local_b8 [8];
  list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> evalStmts;
  Program *program;
  Parser *p;
  Lexer *local_70;
  Lexer *l;
  string local_60 [48];
  undefined1 local_30 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buffer_list;
  Env *env;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Welcome to BEESAFE :) REPL v1.0 ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Type CTRL-D to Exit");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  buffer_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)evaluator::Evaluator::NewEnvironment();
  do {
    std::operator<<((ostream *)&std::cout,">>");
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
    read_lines((istream *)&std::cin,
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30);
    bVar1 = std::ios::eof();
    if ((bVar1 & 1) == 0) {
      join_lines((string *)&p,
                 (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_30);
      l_00 = lexer::Lexer::New((string *)&p);
      std::__cxx11::string::~string((string *)&p);
      local_70 = l_00;
      this = parser::Parser::New(l_00);
      evalStmts.super__List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>.
      _M_impl._M_node._M_size = (size_t)parser::Parser::parseProgram(this);
      poVar3 = std::operator<<((ostream *)&std::cout,"Parse -> ");
      poVar3 = ast::operator<<(poVar3,(Program *)
                                      evalStmts.
                                      super__List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                                      ._M_impl._M_node._M_size);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      bVar2 = parser::Parser::hasErrors(this);
      if (bVar2) {
        parser::Parser::Errors_abi_cxx11_(&local_d0,this);
        spitParseErrors(&local_d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_d0);
      }
      else {
        evaluator::Evaluator::evalProgram_abi_cxx11_
                  ((list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                   local_b8,(Evaluator *)
                            evalStmts.
                            super__List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                            ._M_impl._M_node._M_size,
                   (Program *)
                   buffer_list.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size,in_RCX);
        poVar3 = std::operator<<((ostream *)&std::cout,"evaluated statement size: ");
        sVar4 = std::__cxx11::list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                ::size((list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                       local_b8);
        this_00 = (void *)std::ostream::operator<<(poVar3,sVar4);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,"Eval -> ");
        this_01 = (GCPtr *)std::__cxx11::
                           list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::
                           front((list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                                  *)local_b8);
        obj = GCPtr::operator_cast_to_Object_(this_01);
        poVar3 = symbols::operator<<(poVar3,obj);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::~list
                  ((list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                   local_b8);
      }
      l._4_4_ = 0;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"\t");
      randomMessageGen_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,local_60);
      poVar3 = std::operator<<(poVar3,"...");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_60);
      l._4_4_ = 3;
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  } while (l._4_4_ == 0);
  return 0;
}

Assistant:

int main()
{
    cout << "Welcome to BEESAFE :) REPL v1.0 " << endl;
    cout << "Type CTRL-D to Exit" << endl;
    auto env = Evaluator::NewEnvironment();
    while (true){
        cout << PROMPT;
        list<string> buffer_list;
        read_lines(cin, buffer_list );
        if(cin.eof()){
            cout << "\t" << randomMessageGen() << "..." << endl;
            break;
        }
        auto l = lexer::Lexer::New(join_lines(buffer_list));
        auto p = parser::Parser::New(l);
        auto program = p->parseProgram();
        cout << "Parse -> "<< program << endl;
        if (!p->hasErrors()){
            auto evalStmts = Evaluator::evalProgram(program, env);
            cout << "evaluated statement size: " << evalStmts.size() << endl;
            cout << "Eval -> " << evalStmts.front() << endl;
        }else{
            spitParseErrors(p->Errors());
        }
    }
}